

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_2::PosixColourImpl::setColour(PosixColourImpl *this,char *_escapeCode)

{
  int iVar1;
  IContext *pIVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  undefined4 extraout_var_00;
  ostream *poVar4;
  char *_escapeCode_local;
  PosixColourImpl *this_local;
  
  pIVar2 = getCurrentContext();
  iVar1 = (*pIVar2->_vptr_IContext[4])();
  peVar3 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)CONCAT44(extraout_var,iVar1));
  iVar1 = (*(peVar3->super_NonCopyable)._vptr_NonCopyable[3])();
  poVar4 = std::operator<<((ostream *)CONCAT44(extraout_var_00,iVar1),'\x1b');
  std::operator<<(poVar4,_escapeCode);
  return;
}

Assistant:

void setColour( const char* _escapeCode ) {
            getCurrentContext().getConfig()->stream()
                << '\033' << _escapeCode;
        }